

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O0

void __thiscall SoundConfigTab::apply(SoundConfigTab *this,MidiConfig *midiConfig)

{
  byte bVar1;
  int iVar2;
  bool enabled;
  MidiConfig *midiConfig_local;
  SoundConfigTab *this_local;
  
  bVar1 = QGroupBox::isChecked();
  MidiConfig::setEnabled(midiConfig,(bool)(bVar1 & 1));
  if ((bool)(bVar1 & 1) != false) {
    iVar2 = QComboBox::currentIndex();
    MidiConfig::setBackendIndex(midiConfig,iVar2);
    iVar2 = QComboBox::currentIndex();
    MidiConfig::setPortIndex(midiConfig,iVar2);
  }
  ConfigTab::clean(&this->super_ConfigTab);
  return;
}

Assistant:

void SoundConfigTab::apply(MidiConfig &midiConfig) {
    auto const enabled = mMidiGroup->isChecked();
    midiConfig.setEnabled(enabled);
    if (enabled) {
        midiConfig.setBackendIndex(mMidiGroup->mApiCombo->currentIndex());
        midiConfig.setPortIndex(mMidiGroup->mDeviceCombo->currentIndex());
    }

    clean();
}